

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O3

void __thiscall QDBusListener::saveJson(QDBusListener *this,QString *fileName)

{
  DBusKey *pDVar1;
  long lVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  undefined1 auVar16 [16];
  QJsonObject obj;
  QJsonDocument doc;
  QJsonObject root;
  QJsonArray sigs;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *local_70;
  QByteArray local_68;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68,(QString *)fileName);
  cVar3 = QFile::open((QFile *)&local_68,2);
  if (cVar3 == '\0') {
    lcQpaThemeDBus();
    if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
       ) {
      saveJson();
    }
  }
  else {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_70);
    if ((this->m_signalMap).c.keys.d.size != 0) {
      lVar7 = 0;
      do {
        pDVar1 = (this->m_signalMap).c.keys.d.ptr;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        QJsonObject::QJsonObject((QJsonObject *)&local_78);
        QJsonValue::QJsonValue((QJsonValue *)local_50,(QString *)(pDVar1 + lVar7));
        QVar8.m_data = &DAT_0000000c;
        QVar8.m_size = (qsizetype)&local_78;
        auVar16 = QJsonObject::operator[](QVar8);
        local_88 = auVar16;
        QJsonValueRef::operator=((QJsonValueRef *)local_88,(QJsonValue *)local_50);
        QJsonValue::~QJsonValue((QJsonValue *)local_50);
        QJsonValue::QJsonValue((QJsonValue *)local_50,(QString *)&pDVar1[lVar7].key);
        QVar9.m_data = (char *)0x7;
        QVar9.m_size = (qsizetype)&local_78;
        auVar16 = QJsonObject::operator[](QVar9);
        local_88 = auVar16;
        QJsonValueRef::operator=((QJsonValueRef *)local_88,(QJsonValue *)local_50);
        QJsonValue::~QJsonValue((QJsonValue *)local_50);
        QMetaObject::indexOfEnumerator((char *)&staticMetaObject);
        auVar16 = QMetaObject::enumerator(0x7d1178);
        local_88 = auVar16;
        pcVar4 = (char *)QMetaEnum::valueToKey((ulonglong)local_88);
        if (pcVar4 == (char *)0x0) {
          lVar6 = 0;
        }
        else {
          lVar5 = -1;
          do {
            lVar6 = lVar5 + 1;
            lVar2 = lVar5 + 1;
            lVar5 = lVar6;
          } while (pcVar4[lVar2] != '\0');
        }
        QVar14.m_data = pcVar4;
        QVar14.m_size = lVar6;
        QJsonValue::QJsonValue((QJsonValue *)local_50,QVar14);
        QVar10.m_data = &DAT_00000008;
        QVar10.m_size = (qsizetype)&local_78;
        auVar16 = QJsonObject::operator[](QVar10);
        local_98 = auVar16;
        QJsonValueRef::operator=((QJsonValueRef *)local_98,(QJsonValue *)local_50);
        QJsonValue::~QJsonValue((QJsonValue *)local_50);
        QMetaObject::indexOfEnumerator((char *)&staticMetaObject);
        auVar16 = QMetaObject::enumerator(0x7d1178);
        local_88 = auVar16;
        pcVar4 = (char *)QMetaEnum::valueToKey((ulonglong)local_88);
        if (pcVar4 == (char *)0x0) {
          lVar6 = 0;
        }
        else {
          lVar5 = -1;
          do {
            lVar6 = lVar5 + 1;
            lVar2 = lVar5 + 1;
            lVar5 = lVar6;
          } while (pcVar4[lVar2] != '\0');
        }
        QVar15.m_data = pcVar4;
        QVar15.m_size = lVar6;
        QJsonValue::QJsonValue((QJsonValue *)local_50,QVar15);
        QVar11.m_data = (char *)0x7;
        QVar11.m_size = (qsizetype)&local_78;
        auVar16 = QJsonObject::operator[](QVar11);
        local_98 = auVar16;
        QJsonValueRef::operator=((QJsonValueRef *)local_98,(QJsonValue *)local_50);
        QJsonValue::~QJsonValue((QJsonValue *)local_50);
        QJsonValue::QJsonValue((QJsonValue *)local_50,(QJsonObject *)&local_78);
        QJsonArray::append((QJsonValue *)&local_70);
        QJsonValue::~QJsonValue((QJsonValue *)local_50);
        QJsonObject::~QJsonObject((QJsonObject *)&local_78);
        lVar7 = lVar7 + 1;
      } while (lVar7 != (this->m_signalMap).c.keys.d.size);
    }
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)local_98);
    QJsonValue::QJsonValue((QJsonValue *)local_50,(QJsonArray *)&local_70);
    QVar12.m_data = (char *)0xb;
    QVar12.m_size = (qsizetype)local_98;
    auVar16 = QJsonObject::operator[](QVar12);
    local_88 = auVar16;
    QJsonValueRef::operator=((QJsonValueRef *)local_88,(QJsonValue *)local_50);
    QJsonValue::~QJsonValue((QJsonValue *)local_50);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_78);
    QJsonValue::QJsonValue((QJsonValue *)local_50,(QJsonObject *)local_98);
    QVar13.m_data = (char *)0x14;
    QVar13.m_size = (qsizetype)&local_78;
    auVar16 = QJsonObject::operator[](QVar13);
    local_88 = auVar16;
    QJsonValueRef::operator=((QJsonValueRef *)local_88,(QJsonValue *)local_50);
    QJsonValue::~QJsonValue((QJsonValue *)local_50);
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::QJsonDocument((QJsonDocument *)local_88,(QJsonObject *)&local_78);
    QJsonDocument::toJson(local_50,(QJsonDocument *)local_88,0);
    QIODevice::write(&local_68);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],1,0x10);
      }
    }
    QFileDevice::close();
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_88);
    QJsonObject::~QJsonObject((QJsonObject *)&local_78);
    QJsonObject::~QJsonObject((QJsonObject *)local_98);
    QJsonArray::~QJsonArray((QJsonArray *)&local_70);
  }
  QFile::~QFile((QFile *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusListener::saveJson(const QString &fileName) const
{
    Q_ASSERT(!m_signalMap.isEmpty());
    Q_ASSERT(!fileName.isEmpty());
    QFile file(fileName);
    if (!file.open(QIODevice::WriteOnly)) {
        qCWarning(lcQpaThemeDBus) << fileName << "could not be opened for writing.";
        return;
    }

    QJsonArray sigs;
    for (auto sig = m_signalMap.constBegin(); sig != m_signalMap.constEnd(); ++sig) {
        const DBusKey &dkey = sig.key();
        const ChangeSignal &csig = sig.value();
        QJsonObject obj;
        obj[JsonKeys::dbusLocation()] = dkey.location;
        obj[JsonKeys::dbusKey()] = dkey.key;
        obj[JsonKeys::provider()] = QLatin1StringView(QMetaEnum::fromType<Provider>()
                                            .valueToKey(static_cast<int>(csig.provider)));
        obj[JsonKeys::setting()] = QLatin1StringView(QMetaEnum::fromType<Setting>()
                                           .valueToKey(static_cast<int>(csig.setting)));
        sigs.append(obj);
    }
    QJsonObject obj;
    obj[JsonKeys::dbusSignals()] = sigs;
    QJsonObject root;
    root[JsonKeys::root()] = obj;
    QJsonDocument doc(root);
    file.write(doc.toJson());
    file.close();
}